

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaHash.c
# Opt level: O1

int Gia_ManHashXorReal(Gia_Man_t *p,int iLit0,int iLit1)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint *puVar4;
  uint uVar5;
  uint iLit1_00;
  uint uVar6;
  
  if (p->fAddStrash != 0) {
    __assert_fail("p->fAddStrash == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaHash.c"
                  ,0x1d8,"int Gia_ManHashXorReal(Gia_Man_t *, int, int)");
  }
  if (iLit0 < 2) {
    uVar5 = iLit1;
    if (iLit0 != 0) {
      if (iLit1 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x131,"int Abc_LitNot(int)");
      }
      uVar5 = iLit1 ^ 1;
    }
  }
  else if (iLit1 < 2) {
    uVar5 = (uint)(iLit1 != 0) ^ iLit0;
  }
  else {
    uVar5 = 0;
    if (iLit0 != iLit1) {
      uVar6 = iLit1 ^ iLit0;
      uVar5 = 1;
      if (uVar6 != 1) {
        if (((char)p->nObjs == '\0') &&
           ((p->vHTable).nSize * 2 < p->nObjs + ~(p->vCos->nSize + p->vCis->nSize))) {
          Gia_ManHashResize(p);
        }
        uVar5 = iLit1;
        if (iLit1 < iLit0) {
          uVar5 = iLit0;
        }
        if (iLit0 < iLit1) {
          iLit1 = iLit0;
        }
        if (((int)uVar5 < 0) || (iLit1 < 0)) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x130,"int Abc_LitIsCompl(int)");
        }
        uVar5 = uVar5 & 0x7ffffffe;
        iLit1_00 = iLit1 & 0x7ffffffe;
        uVar6 = uVar6 & 1;
        puVar4 = (uint *)Gia_ManHashFind(p,uVar5,iLit1_00,-1);
        uVar3 = *puVar4;
        if (uVar3 == 0) {
          p->nHashMiss = p->nHashMiss + 1;
          iVar1 = (p->vHash).nSize;
          iVar2 = (p->vHash).nCap;
          uVar3 = Gia_ManAppendXorReal(p,uVar5,iLit1_00);
          if ((iVar2 <= iVar1) &&
             (puVar4 = (uint *)Gia_ManHashFind(p,uVar5,iLit1_00,-1), *puVar4 != 0)) {
            __assert_fail("*pPlace == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaHash.c"
                          ,0x1f7,"int Gia_ManHashXorReal(Gia_Man_t *, int, int)");
          }
          if ((int)uVar3 < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x12f,"int Abc_Lit2Var(int)");
          }
          *puVar4 = uVar3 >> 1;
          uVar5 = uVar3 & 0xfffffffe | uVar6;
        }
        else {
          p->nHashHit = p->nHashHit + 1;
          if ((int)uVar3 < 0) {
            __assert_fail("Var >= 0 && !(c >> 1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x12e,"int Abc_Var2Lit(int, int)");
          }
          uVar5 = uVar6 + uVar3 * 2;
        }
      }
    }
  }
  return uVar5;
}

Assistant:

int Gia_ManHashXorReal( Gia_Man_t * p, int iLit0, int iLit1 )  
{ 
    int fCompl = 0;
    assert( p->fAddStrash == 0 );
    if ( iLit0 < 2 )
        return iLit0 ? Abc_LitNot(iLit1) : iLit1;
    if ( iLit1 < 2 )
        return iLit1 ? Abc_LitNot(iLit0) : iLit0;
    if ( iLit0 == iLit1 )
        return 0;
    if ( iLit0 == Abc_LitNot(iLit1) )
        return 1;
    if ( (p->nObjs & 0xFF) == 0 && 2 * Vec_IntSize(&p->vHTable) < Gia_ManAndNum(p) )
        Gia_ManHashResize( p );
    if ( iLit0 < iLit1 )
        iLit0 ^= iLit1, iLit1 ^= iLit0, iLit0 ^= iLit1;
    if ( Abc_LitIsCompl(iLit0) )
        iLit0 = Abc_LitNot(iLit0), fCompl ^= 1;
    if ( Abc_LitIsCompl(iLit1) )
        iLit1 = Abc_LitNot(iLit1), fCompl ^= 1;
    {
        int *pPlace = Gia_ManHashFind( p, iLit0, iLit1, -1 );
        if ( *pPlace )
        {
            p->nHashHit++;
            return Abc_Var2Lit( *pPlace, fCompl );
        }
        p->nHashMiss++;
        if ( Vec_IntSize(&p->vHash) < Vec_IntCap(&p->vHash) )
            *pPlace = Abc_Lit2Var( Gia_ManAppendXorReal( p, iLit0, iLit1 ) );
        else
        {
            int iNode = Gia_ManAppendXorReal( p, iLit0, iLit1 );
            pPlace = Gia_ManHashFind( p, iLit0, iLit1, -1 );
            assert( *pPlace == 0 );
            *pPlace = Abc_Lit2Var( iNode );
        }
        return Abc_Var2Lit( *pPlace, fCompl );
    }
}